

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

void luaG_traceexec(lua_State *L)

{
  int *piVar1;
  uint uVar2;
  CallInfo *pCVar3;
  long lVar4;
  long lVar5;
  ushort uVar6;
  Instruction *pIVar7;
  int line;
  byte bVar8;
  int iVar9;
  
  pCVar3 = L->ci;
  uVar2 = L->hookmask;
  piVar1 = &L->hookcount;
  *piVar1 = *piVar1 + -1;
  bVar8 = (byte)((uVar2 & 8) >> 3) & *piVar1 == 0;
  if (bVar8 == 0) {
    if ((uVar2 & 4) == 0) {
      return;
    }
    uVar6 = pCVar3->callstatus;
    if ((uVar6 & 0x40) != 0) goto LAB_00112932;
LAB_00112903:
    pIVar7 = (pCVar3->u).l.savedpc;
    lVar4 = *(long *)((pCVar3->func->value_).f + 0x18);
    lVar5 = *(long *)(lVar4 + 0x38);
    lVar4 = *(long *)(lVar4 + 0x48);
    iVar9 = (int)((ulong)((long)pIVar7 - lVar5) >> 2) + -1;
    if (lVar4 == 0) {
      line = -1;
    }
    else {
      line = *(int *)(lVar4 + (long)iVar9 * 4);
    }
    if ((iVar9 == 0) || (pIVar7 <= L->oldpc)) {
LAB_0011297e:
      luaD_hook(L,2,line);
    }
    else {
      if (lVar4 == 0) {
        iVar9 = -1;
      }
      else {
        iVar9 = *(int *)(lVar4 + (((long)L->oldpc - lVar5) * 0x40000000 + -0x100000000 >> 0x20) * 4)
        ;
      }
      if (line != iVar9) goto LAB_0011297e;
    }
    pIVar7 = (pCVar3->u).l.savedpc;
    L->oldpc = pIVar7;
    if (L->status != '\x01') {
      return;
    }
    if (bVar8 == 0) goto LAB_001129ba;
  }
  else {
    L->hookcount = L->basehookcount;
    uVar6 = pCVar3->callstatus;
    if ((uVar6 & 0x40) != 0) {
LAB_00112932:
      pCVar3->callstatus = uVar6 & 0xffbf;
      return;
    }
    luaD_hook(L,3,-1);
    if ((uVar2 & 4) != 0) goto LAB_00112903;
    L->oldpc = (pCVar3->u).l.savedpc;
    if (L->status != '\x01') {
      return;
    }
  }
  L->hookcount = 1;
  pIVar7 = (pCVar3->u).l.savedpc;
LAB_001129ba:
  (pCVar3->u).l.savedpc = pIVar7 + -1;
  *(byte *)&pCVar3->callstatus = (byte)pCVar3->callstatus | 0x40;
  pCVar3->func = L->top + -1;
  luaD_throw(L,1);
}

Assistant:

void luaG_traceexec (lua_State *L) {
  CallInfo *ci = L->ci;
  lu_byte mask = L->hookmask;
  int counthook = (--L->hookcount == 0 && (mask & LUA_MASKCOUNT));
  if (counthook)
    resethookcount(L);  /* reset count */
  else if (!(mask & LUA_MASKLINE))
    return;  /* no line hook and count != 0; nothing to be done */
  if (ci->callstatus & CIST_HOOKYIELD) {  /* called hook last time? */
    ci->callstatus &= ~CIST_HOOKYIELD;  /* erase mark */
    return;  /* do not call hook again (VM yielded, so it did not move) */
  }
  if (counthook)
    luaD_hook(L, LUA_HOOKCOUNT, -1);  /* call count hook */
  if (mask & LUA_MASKLINE) {
    Proto *p = ci_func(ci)->p;
    int npc = pcRel(ci->u.l.savedpc, p);
    int newline = getfuncline(p, npc);
    if (npc == 0 ||  /* call linehook when enter a new function, */
        ci->u.l.savedpc <= L->oldpc ||  /* when jump back (loop), or when */
        newline != getfuncline(p, pcRel(L->oldpc, p)))  /* enter a new line */
      luaD_hook(L, LUA_HOOKLINE, newline);  /* call line hook */
  }
  L->oldpc = ci->u.l.savedpc;
  if (L->status == LUA_YIELD) {  /* did hook yield? */
    if (counthook)
      L->hookcount = 1;  /* undo decrement to zero */
    ci->u.l.savedpc--;  /* undo increment (resume will increment it again) */
    ci->callstatus |= CIST_HOOKYIELD;  /* mark that it yielded */
    ci->func = L->top - 1;  /* protect stack below results */
    luaD_throw(L, LUA_YIELD);
  }
}